

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O1

bool __thiscall Clasp::mt::ParallelSolve::requestWork(ParallelSolve *this,Solver *s,PathPtr *out)

{
  bool bVar1;
  LitVec *x;
  int iVar2;
  bool bVar3;
  
  bVar3 = ((this->shared_->control).super___atomic_base<unsigned_int>._M_i & 1) == 0;
  if (bVar3) {
    iVar2 = 0;
    x = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0;
    do {
      if ((iVar2 != 0) ||
         (bVar1 = Solver::popRootLevel(s,(s->levels_).root,(LitVec *)0x0,true), bVar1)) {
        iVar2 = iVar2 + 1;
        if (((this->shared_->control).super___atomic_base<unsigned_int>._M_i & 2) == 0) {
          if ((x == (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0) &&
             (x = SharedData::requestWork(this->shared_,s), x == (LitVec *)0x0)) {
            if (((this->shared_->control).super___atomic_base<unsigned_int>._M_i & 2) == 0) {
              terminate(this,s,true);
            }
            x = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0;
          }
          else {
            SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
            ::reset(out,x);
            if (x == this->shared_->path) {
              *(byte *)&out->ptr_ = (byte)out->ptr_ & 0xfe;
            }
            bVar1 = Solver::simplify(s);
            iVar2 = 0;
            if (bVar1) {
              return bVar3;
            }
          }
        }
        else {
          waitOnSync(this,s);
        }
      }
      else {
        iVar2 = 1;
        terminate(this,s,true);
      }
      bVar3 = ((this->shared_->control).super___atomic_base<unsigned_int>._M_i & 1) == 0;
    } while (bVar3);
  }
  return bVar3;
}

Assistant:

bool ParallelSolve::requestWork(Solver& s, PathPtr& out) {
	const LitVec* a = 0;
	for (int popped = 0; !shared_->terminate();) {
		// only clear path and stop conflict - we don't propagate() here
		// because we would then have to handle any eventual conflicts
		if (++popped == 1 && !s.popRootLevel(s.rootLevel())) {
			// s has a real top-level conflict - problem is unsat
			terminate(s, true);
		}
		else if (shared_->synchronize()) {
			// a synchronize request is active - we are fine with
			// this but did not yet have a chance to react on it
			waitOnSync(s);
		}
		else if (a || (a = shared_->requestWork(s)) != 0) {
			assert(s.decisionLevel() == 0);
			// got new work from work-queue
			out = a;
			// do not take over ownership of initial gp!
			if (a == shared_->path) { out.release(); }
			// propagate any new facts before starting new work
			if (s.simplify())       { return true; }
			// s now has a conflict - either an artificial stop conflict
			// or a real conflict - we'll handle it in the next iteration
			// via the call to popRootLevel()
			popped = 0;
		}
		else if (!shared_->synchronize()) {
			// no work left - quitting time?
			terminate(s, true);
		}
	}
	return false;
}